

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_k_llp.c
# Opt level: O2

void gga_k_llp_init(xc_func_type *p)

{
  int iVar1;
  undefined4 *puVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  
  puVar2 = (undefined4 *)malloc(0x10);
  p->params = puVar2;
  iVar1 = p->info->number;
  if (iVar1 == 0x20a) {
    uVar3 = 0xd1fc4845;
    uVar4 = 0x3f70d78a;
    uVar5 = 0x44c46994;
    uVar6 = 0x40189caf;
  }
  else {
    if (iVar1 != 0x202) {
      fwrite("Internal error in gga_k_llp\n",0x1c,1,_stderr);
      exit(1);
    }
    uVar3 = 0xead02c36;
    uVar4 = 0x3f718470;
    uVar5 = 0x9ad2b51c;
    uVar6 = 0x4019f1fc;
  }
  *puVar2 = uVar3;
  puVar2[1] = uVar4;
  puVar2[2] = uVar5;
  puVar2[3] = uVar6;
  return;
}

Assistant:

static void
gga_k_llp_init(xc_func_type *p)
{
  gga_k_llp_params *params;

  assert(p!=NULL && p->params == NULL);
  p->params = libxc_malloc(sizeof(gga_k_llp_params));
  params = (gga_k_llp_params *) (p->params);

  /* value of beta in standard Becke 88 functional */
  switch(p->info->number){
  case XC_GGA_K_LLP:
    params->beta  = X_FACTOR_C*0.0044188;
    params->gamma = 0.0253/(X_FACTOR_C*0.0044188);
    break;
  case XC_GGA_K_FR_B88:
    params->beta  = X_FACTOR_C*0.004596;
    params->gamma = 0.02774/(X_FACTOR_C*0.004596);
    break;
  default:
    fprintf(stderr, "Internal error in gga_k_llp\n");
    exit(1);
  }
}